

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::memberDecl(Parser *this,ptr<ObjectExpression> *descriptor)

{
  initializer_list<TokenType> __l;
  bool bVar1;
  allocator<TokenType> local_55;
  TokenType local_54 [3];
  iterator local_48;
  size_type local_40;
  vector<TokenType,_std::allocator<TokenType>_> local_38;
  Scope local_1c;
  ptr<ObjectExpression> *ppStack_18;
  Scope scope;
  ptr<ObjectExpression> *descriptor_local;
  Parser *this_local;
  
  local_1c = Public;
  ppStack_18 = descriptor;
  descriptor_local = (ptr<ObjectExpression> *)this;
  bVar1 = match(this,Public);
  if (bVar1) {
    consume(this);
  }
  else {
    bVar1 = match(this,Private);
    if (bVar1) {
      local_1c = Private;
      consume(this);
    }
  }
  local_54[0] = Let;
  local_54[1] = 0x2b;
  local_54[2] = 0x30;
  local_48 = local_54;
  local_40 = 3;
  std::allocator<TokenType>::allocator(&local_55);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<TokenType,_std::allocator<TokenType>_>::vector(&local_38,__l,&local_55);
  bVar1 = matchAny(this,&local_38);
  std::vector<TokenType,_std::allocator<TokenType>_>::~vector(&local_38);
  std::allocator<TokenType>::~allocator(&local_55);
  if (bVar1) {
    attributeDecl(this,ppStack_18,local_1c);
  }
  else {
    bVar1 = match(this,Function);
    if (bVar1) {
      method(this,ppStack_18,local_1c);
    }
    else {
      unexpected(this);
    }
  }
  return;
}

Assistant:

void Parser::memberDecl(ptr<ObjectExpression> &descriptor) {
    Scope scope = Scope::Public;

    if(match(TokenType::Public)) {
        consume();
    } else if(match(TokenType::Private)) {
        scope = Scope::Private;
        consume();
    }

    if(matchAny({ TokenType::Let, TokenType::Const, TokenType::Identifier }))
        attributeDecl(descriptor, scope);
    else if(match(TokenType::Function))
        method(descriptor, scope);
    else {
        unexpected();
    }
}